

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_PreventExtensions(JSContext *ctx,JSValue obj)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  JSProxyData *argv;
  JSValue JVar4;
  JSValueUnion local_30;
  int64_t local_28;
  
  if ((int)obj.tag == -1) {
    if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
      pbVar1 = (byte *)((long)obj.u.ptr + 5);
      *pbVar1 = *pbVar1 & 0xfe;
      return 1;
    }
    argv = get_proxy_method(ctx,(JSValue *)&local_30,obj,0x62);
    if (argv == (JSProxyData *)0x0) {
      return -1;
    }
    if ((int)local_28 == 3) {
      iVar2 = JS_PreventExtensions(ctx,argv->target);
      return iVar2;
    }
    JVar4.tag = local_28;
    JVar4.u.float64 = local_30.float64;
    JVar4 = JS_CallFree(ctx,JVar4,argv->handler,1,&argv->target);
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    iVar2 = JS_ToBoolFree(ctx,JVar4);
    if (iVar2 != 0) {
      iVar3 = JS_IsExtensible(ctx,argv->target);
      if (iVar3 < 0) {
        return -1;
      }
      if (iVar3 == 0) {
        return iVar2;
      }
      JS_ThrowTypeError(ctx,"proxy: inconsistent preventExtensions");
      return -1;
    }
  }
  return 0;
}

Assistant:

int JS_PreventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_preventExtensions(ctx, obj);
    p->extensible = FALSE;
    return TRUE;
}